

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skeleton_blocker_complex.cpp
# Opt level: O3

void __thiscall
test_skeleton_blocker_complex_link5::test_method(test_skeleton_blocker_complex_link5 *this)

{
  ostream *poVar1;
  long *plVar2;
  Simplex alpha;
  Skeleton_blocker_link_complex L;
  Complex complex;
  string local_230;
  undefined1 local_210;
  undefined8 local_208;
  shared_count sStack_200;
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  local_1f8;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  local_188;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> local_b0;
  
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  Skeleton_blocker_complex(&local_b0,0,(Visitor *)0x0);
  build_complete(4,&local_b0);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              *)&local_188,(Vertex_handle)0x0,(Vertex_handle)0x1,(Vertex_handle)0x2,
             (Vertex_handle)0x3);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_blocker
            (&local_b0,(Simplex *)&local_188);
  std::
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::~_Rb_tree((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
               *)&local_188);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              *)&local_1f8,(Vertex_handle)0x0,(Vertex_handle)0x1,(Vertex_handle)0x2);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  ::Skeleton_blocker_link_complex(&local_188,&local_b0,(Simplex *)&local_1f8,false,false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Complex: ",9);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  to_string_abi_cxx11_(&local_230,&local_b0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::clog,local_230._M_dataplus._M_p,
                      CONCAT71(local_230._M_string_length._1_7_,
                               (undefined1)local_230._M_string_length));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Link: ",6);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  to_string_abi_cxx11_
            (&local_230,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             &local_188);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::clog,local_230._M_dataplus._M_p,
                      CONCAT71(local_230._M_string_length._1_7_,
                               (undefined1)local_230._M_string_length));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_complex.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x218);
  local_210 = (int)local_188.
                   super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
                   .
                   super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                   .num_vertices_ == 0;
  local_208 = 0;
  sStack_200.pi_ = (sp_counted_base *)0x0;
  local_230.field_2._8_8_ = &local_1b8;
  local_1b8 = "L.num_vertices() == 0";
  local_1b0 = "";
  local_230._M_string_length._0_1_ = 0;
  local_230._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00136bb0;
  local_230.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_complex.cpp"
  ;
  local_1c0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_200);
  local_188.
  super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  .super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>.
  _vptr_Skeleton_blocker_complex = (_func_int **)&PTR__Skeleton_blocker_sub_complex_001369c0;
  std::
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::_Select1st<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
  ::~_Rb_tree(&local_188.
               super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
               .addresses._M_t);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  ~Skeleton_blocker_complex
            ((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             &local_188);
  std::
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::~_Rb_tree(&local_1f8);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  ~Skeleton_blocker_complex(&local_b0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_skeleton_blocker_complex_link5) {
  Complex complex(0);
  // Build the complexes
  build_complete(4, complex);
  complex.add_blocker(Simplex(Vertex_handle(0), Vertex_handle(1), Vertex_handle(2), Vertex_handle(3)));

  Simplex alpha(Vertex_handle(0), Vertex_handle(1), Vertex_handle(2));
  Skeleton_blocker_link_complex L(complex, alpha);
  // Complexes built

  // Print result
  std::clog << "Complex: " << complex.to_string()<< std::endl << std::endl;
  std::clog << "Link: " << L.to_string() << std::endl;

  // verification
  BOOST_CHECK(L.num_vertices() == 0);
}